

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterplayer.cpp
# Opt level: O3

bool TryPunch(APlayerPawn *pmo,DAngle *angle,int damage,int power)

{
  int iVar1;
  PClassActor *pufftype;
  char *name;
  bool bVar2;
  FTranslatedLineTarget t;
  undefined1 local_80 [12];
  FName local_74;
  FTranslatedLineTarget local_70;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  AActor **local_40;
  AActor *local_38;
  
  local_38 = (AActor *)angle->Degrees;
  local_40 = (AActor **)0x0;
  bVar2 = false;
  P_AimLineAttack((AActor *)local_80,(DAngle *)pmo,128.0,(FTranslatedLineTarget *)&local_38,
                  (DAngle *)&local_70,(int)&local_40,(AActor *)0x0,(AActor *)0x0);
  if (local_70.linetarget != (AActor *)0x0) {
    iVar1 = (pmo->super_AActor).weaponspecial;
    (pmo->super_AActor).weaponspecial = iVar1 + 1;
    name = "PunchPuff";
    if (1 < iVar1) {
      name = "HammerPuff";
    }
    pufftype = PClass::FindActor(name);
    local_48 = (DAngle)angle->Degrees;
    local_50.Degrees = (double)local_80._0_8_;
    local_74.Index = 0x84;
    P_LineAttack(&pmo->super_AActor,&local_48,128.0,&local_50,damage << (1 < iVar1),&local_74,
                 pufftype,1,&local_70,(int *)0x0);
    if (local_70.linetarget == (AActor *)0x0) {
      bVar2 = false;
    }
    else {
      if (((local_70.linetarget)->player != (player_t *)0x0) ||
         (((local_70.linetarget)->Mass != 0x7fffffff &&
          ((((local_70.linetarget)->flags3).Value & 0x2000) != 0)))) {
        local_58.Degrees = local_70.angleFromSource.Degrees;
        AActor::Thrust(local_70.linetarget,&local_58,
                       *(double *)(&DAT_00774660 + (ulong)(1 < iVar1) * 8));
      }
      AdjustPlayerAngle(&pmo->super_AActor,&local_70);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

static bool TryPunch(APlayerPawn *pmo, DAngle angle, int damage, int power)
{
	PClassActor *pufftype;
	FTranslatedLineTarget t;
	DAngle slope;

	slope = P_AimLineAttack (pmo, angle, 2*MELEERANGE, &t);
	if (t.linetarget != NULL)
	{
		if (++pmo->weaponspecial >= 3)
		{
			damage <<= 1;
			power *= 3;
			pufftype = PClass::FindActor("HammerPuff");
		}
		else
		{
			pufftype = PClass::FindActor("PunchPuff");
		}
		P_LineAttack (pmo, angle, 2*MELEERANGE, slope, damage, NAME_Melee, pufftype, true, &t);
		if (t.linetarget != NULL)
		{
			if (t.linetarget->player != NULL || 
				(t.linetarget->Mass != INT_MAX && (t.linetarget->flags3 & MF3_ISMONSTER)))
			{
				t.linetarget->Thrust(t.angleFromSource, power);
			}
			AdjustPlayerAngle (pmo, &t);
			return true;
		}
	}
	return false;
}